

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O0

CBNode * __thiscall asmjit::CodeBuilder::addAfter(CodeBuilder *this,CBNode *node,CBNode *ref)

{
  CBNode *pCVar1;
  CBNode *in_RDX;
  CBNode *in_RSI;
  long in_RDI;
  CBNode *next;
  CBNode *prev;
  char *in_stack_000003c0;
  int in_stack_000003cc;
  char *in_stack_000003d0;
  
  if (in_RSI == (CBNode *)0x0) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  if (in_RDX == (CBNode *)0x0) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  if (in_RSI->_prev != (CBNode *)0x0) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  if (in_RSI->_next != (CBNode *)0x0) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  pCVar1 = in_RDX->_next;
  in_RSI->_prev = in_RDX;
  in_RSI->_next = pCVar1;
  in_RDX->_next = in_RSI;
  if (pCVar1 == (CBNode *)0x0) {
    *(CBNode **)(in_RDI + 0x178) = in_RSI;
  }
  else {
    pCVar1->_prev = in_RSI;
  }
  return in_RSI;
}

Assistant:

CBNode* CodeBuilder::addAfter(CBNode* node, CBNode* ref) noexcept {
  ASMJIT_ASSERT(node);
  ASMJIT_ASSERT(ref);

  ASMJIT_ASSERT(node->_prev == nullptr);
  ASMJIT_ASSERT(node->_next == nullptr);

  CBNode* prev = ref;
  CBNode* next = ref->_next;

  node->_prev = prev;
  node->_next = next;

  prev->_next = node;
  if (next)
    next->_prev = node;
  else
    _lastNode = node;

  return node;
}